

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  cmMakefile *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  ManagedType MVar5;
  mapped_type *pmVar6;
  cmLinkInterface *pcVar7;
  cmValue cVar8;
  string value;
  string prop;
  allocator<char> local_b1;
  string *local_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [48];
  string *local_38;
  
  this_00 = target->Makefile;
  local_b0 = config;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 != SHARED_LIBRARY) {
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 != MODULE_LIBRARY) goto LAB_00314d23;
  }
  bVar3 = cmGeneratorTarget::IsDLLPlatform(target);
  if (!bVar3) {
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = 0;
    local_68[0x10] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    bVar3 = cmGeneratorTarget::HasSOName(target,local_b0);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_b1);
      bVar3 = cmMakefile::IsOn(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar3) {
        (*this->_vptr_cmExportFileGenerator[0x15])(&local_88,this,target);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::assign(local_68);
      cmGeneratorTarget::GetSOName(&local_88,target,local_b0,RuntimeBinaryArtifact);
      std::__cxx11::string::append((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::__cxx11::string::assign(local_68);
      std::__cxx11::string::assign((char *)&local_a8);
    }
    std::__cxx11::string::append((string *)local_68);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_68);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_68);
  }
LAB_00314d23:
  pcVar7 = cmGeneratorTarget::GetLinkInterface(target,local_b0,target);
  if (pcVar7 != (cmLinkInterface *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator<char> *)&local_a8);
    local_38 = suffix;
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,(string *)local_68,&pcVar7->Languages,properties,No);
    std::__cxx11::string::~string((string *)local_68);
    pbVar1 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->MissingTargets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)local_68,&(this->ExternalTargets)._M_t);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator<char> *)&local_88)
    ;
    SetImportLinkProperty<cmLinkItem>
              (this,local_38,target,&local_a8,&pcVar7->SharedDeps,properties,Yes);
    std::__cxx11::string::~string((string *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->MissingTargets,(long)pbVar1 - (long)pbVar2 >> 5);
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::operator=(&(this->ExternalTargets)._M_t,
                (_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)local_68);
    suffix = local_38;
    if (pcVar7->Multiplicity != 0) {
      cmStrCat<char_const(&)[37],std::__cxx11::string_const&>
                (&local_a8,(char (*) [37])"IMPORTED_LINK_INTERFACE_MULTIPLICITY",local_38);
      std::__cxx11::to_string(&local_88,pcVar7->Multiplicity);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_a8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 *)local_68);
  }
  MVar5 = cmGeneratorTarget::GetManagedType(target,local_b0);
  if (MVar5 != Native) {
    cmStrCat<char_const(&)[33],std::__cxx11::string_const&>
              ((string *)local_68,(char (*) [33])"IMPORTED_COMMON_LANGUAGE_RUNTIME",suffix);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"COMMON_LANGUAGE_RUNTIME",&local_b1);
    cVar8 = cmGeneratorTarget::GetProperty(target,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (cVar8.Value == (string *)0x0) {
      bVar3 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar3) {
        std::__cxx11::string::assign((char *)&local_a8);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_a8);
    }
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_68);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LANGUAGES", iface->Languages,
      properties, ImportLinkPropertyTargetNames::No);

    // Export IMPORTED_LINK_DEPENDENT_LIBRARIES to help consuming linkers
    // find private dependencies of shared libraries.
    std::size_t oldMissingTargetsSize = this->MissingTargets.size();
    auto oldExternalTargets = this->ExternalTargets;
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_DEPENDENT_LIBRARIES", iface->SharedDeps,
      properties, ImportLinkPropertyTargetNames::Yes);
    // Avoid enforcing shared library private dependencies as public package
    // dependencies by ignoring missing targets added for them.
    this->MissingTargets.resize(oldMissingTargetsSize);
    this->ExternalTargets = std::move(oldExternalTargets);

    if (iface->Multiplicity > 0) {
      std::string prop =
        cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
      properties[prop] = std::to_string(iface->Multiplicity);
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = cmStrCat("IMPORTED_COMMON_LANGUAGE_RUNTIME", suffix);
    std::string propval;
    if (cmValue p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = *p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}